

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_htable_strvp.c
# Opt level: O0

ares_bool_t ares_htable_strvp_insert(ares_htable_strvp_t *htable,char *key,void *val)

{
  ares_bool_t aVar1;
  char *pcVar2;
  long *local_30;
  ares_htable_strvp_bucket_t *bucket;
  void *val_local;
  char *key_local;
  ares_htable_strvp_t *htable_local;
  
  local_30 = (long *)0x0;
  if (((htable != (ares_htable_strvp_t *)0x0) && (key != (char *)0x0)) &&
     (local_30 = (long *)ares_malloc(0x18), local_30 != (long *)0x0)) {
    local_30[2] = (long)htable;
    pcVar2 = ares_strdup(key);
    *local_30 = (long)pcVar2;
    if (*local_30 != 0) {
      local_30[1] = (long)val;
      aVar1 = ares_htable_insert(htable->hash,local_30);
      if (aVar1 != ARES_FALSE) {
        return ARES_TRUE;
      }
    }
  }
  if (local_30 != (long *)0x0) {
    ares_free((void *)*local_30);
    ares_free(local_30);
  }
  return ARES_FALSE;
}

Assistant:

ares_bool_t ares_htable_strvp_insert(ares_htable_strvp_t *htable,
                                     const char *key, void *val)
{
  ares_htable_strvp_bucket_t *bucket = NULL;

  if (htable == NULL || key == NULL) {
    goto fail;
  }

  bucket = ares_malloc(sizeof(*bucket));
  if (bucket == NULL) {
    goto fail;
  }

  bucket->parent = htable;
  bucket->key    = ares_strdup(key);
  if (bucket->key == NULL) {
    goto fail;
  }
  bucket->val = val;

  if (!ares_htable_insert(htable->hash, bucket)) {
    goto fail;
  }

  return ARES_TRUE;

fail:
  if (bucket) {
    ares_free(bucket->key);
    ares_free(bucket);
  }
  return ARES_FALSE;
}